

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags.h
# Opt level: O3

ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger> * __thiscall
AutoArgParse::ComplexFlag<AutoArgParse::DoNothingTrigger>::makeExclusiveGroup
          (ComplexFlag<AutoArgParse::DoNothingTrigger> *this,Policy policy)

{
  ulong __val;
  bool bVar1;
  char cVar2;
  long *plVar3;
  ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger> *pEVar4;
  ulong uVar5;
  size_type *psVar6;
  char cVar7;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_false,_true>,_bool>
  pVar8;
  string randomName;
  string __str;
  value_type local_70;
  long *local_50;
  uint local_48;
  long local_40 [2];
  ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger> *local_30;
  
  __val = (this->store).flags._M_h._M_element_count;
  cVar7 = '\x01';
  if (9 < __val) {
    uVar5 = __val;
    cVar2 = '\x04';
    do {
      cVar7 = cVar2;
      if (uVar5 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_0010588f;
      }
      if (uVar5 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_0010588f;
      }
      if (uVar5 < 10000) goto LAB_0010588f;
      bVar1 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      cVar2 = cVar7 + '\x04';
    } while (bVar1);
    cVar7 = cVar7 + '\x01';
  }
LAB_0010588f:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_50,local_48,__val);
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_50,RANDOM_STRING_abi_cxx11_);
  psVar6 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_70.field_2._M_allocated_capacity = *psVar6;
    local_70.field_2._8_8_ = plVar3[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar6;
    local_70._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_70._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pEVar4 = (ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger> *)operator_new(0x90);
  ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger>::ExclusiveFlagGroup(pEVar4,this,policy);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  local_30 = pEVar4;
  pVar8 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<AutoArgParse::FlagBase,std::default_delete<AutoArgParse::FlagBase>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<AutoArgParse::FlagBase,std::default_delete<AutoArgParse::FlagBase>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::pair<std::__cxx11::string,std::unique_ptr<AutoArgParse::FlagBase,std::default_delete<AutoArgParse::FlagBase>>>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<AutoArgParse::FlagBase,std::default_delete<AutoArgParse::FlagBase>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<AutoArgParse::FlagBase,std::default_delete<AutoArgParse::FlagBase>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&(this->store).flags);
  if (local_30 != (ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger> *)0x0) {
    (*(local_30->super_FlagBase).super_ParseToken._vptr_ParseToken[1])();
  }
  local_30 = (ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger> *)0x0;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->store).flagInsertionOrder,&local_70);
  pEVar4 = *(ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger> **)
            ((long)pVar8.first.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
                   ._M_cur.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
            + 0x28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return pEVar4;
}

Assistant:

inline ExclusiveFlagGroup<T>& ComplexFlag<T>::makeExclusiveGroup(
    Policy policy) {
    std::string randomName = std::to_string(store.flags.size()) + RANDOM_STRING;
    auto flagIter = store.flags.insert(std::make_pair(
        randomName,
        std::unique_ptr<FlagBase>(new ExclusiveFlagGroup<T>(*this, policy))));
    store.flagInsertionOrder.push_back(randomName);
    return *(static_cast<ExclusiveFlagGroup<T>*>(flagIter.first->second.get()));
}